

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode readwrite_data(Curl_easy *data,connectdata *conn,SingleRequest *k,int *didwhat,_Bool *done,
                       _Bool *comeback)

{
  size_t thismuch;
  int iVar1;
  int *piVar2;
  connectdata *data_00;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  int local_bc;
  size_t local_a0;
  size_t dataleft;
  CHUNKcode res;
  _Bool stop_reading;
  __suseconds_t local_80;
  long local_78;
  curl_off_t totalleft;
  size_t bytestoread;
  size_t buffersize;
  int maxloops;
  _Bool readmore;
  _Bool is_empty_data;
  size_t excess;
  ssize_t nread;
  _Bool *p_Stack_40;
  CURLcode result;
  _Bool *comeback_local;
  _Bool *done_local;
  int *didwhat_local;
  SingleRequest *k_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  nread._4_4_ = CURLE_OK;
  _maxloops = 0;
  buffersize._7_1_ = 0;
  buffersize._6_1_ = 0;
  buffersize._0_4_ = 100;
  *done = false;
  *comeback = false;
  p_Stack_40 = comeback;
  comeback_local = done;
  done_local = (_Bool *)didwhat;
  didwhat_local = (int *)k;
  k_local = (SingleRequest *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    if (*(long *)(conn_local->syserr_buf + 0xa8) == 0) {
      local_a0 = 0x4000;
    }
    else {
      local_a0 = *(size_t *)(conn_local->syserr_buf + 0xa8);
    }
    bytestoread = local_a0;
    totalleft = local_a0;
    if (((*(long *)didwhat_local != -1) && ((*(byte *)(didwhat_local + 0x18) & 1) == 0)) &&
       (local_78 = *(long *)didwhat_local - *(long *)(didwhat_local + 8), local_78 < (long)local_a0)
       ) {
      totalleft = local_78;
    }
    if (totalleft == 0) {
      excess = 0;
    }
    else {
      nread._4_4_ = Curl_read((connectdata *)k_local,*(curl_socket_t *)&k_local[1].protop,
                              *(char **)(didwhat_local + 0x56),totalleft,(ssize_t *)&excess);
      if (nread._4_4_ == CURLE_AGAIN) goto LAB_00142fed;
      if (nread._4_4_ != CURLE_OK) {
        return nread._4_4_;
      }
    }
    if (((*(long *)(didwhat_local + 8) == 0) && (*(long *)(didwhat_local + 10) == 0)) &&
       (Curl_pgrsTime((Curl_easy *)conn_local,TIMER_STARTTRANSFER), piVar2 = didwhat_local,
       didwhat_local[0x32] != 0)) {
      _res = curlx_tvnow();
      *(__time_t *)(piVar2 + 0x2e) = _res;
      *(__suseconds_t *)(piVar2 + 0x30) = local_80;
    }
    *(uint *)done_local = *(uint *)done_local | 1;
    buffersize._7_1_ = false;
    if (excess == 0) {
      buffersize._7_1_ = *(long *)(didwhat_local + 0x54) == 0;
    }
    if ((0 < (long)excess) || ((bool)buffersize._7_1_)) {
      *(undefined1 *)(*(long *)(didwhat_local + 0x56) + excess) = 0;
    }
    else if ((long)excess < 1) {
      didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
      goto LAB_00142fed;
    }
    *(undefined8 *)(didwhat_local + 0x20) = *(undefined8 *)(didwhat_local + 0x56);
    if (*(long *)(k_local[1].upload_present + 0x68) != 0) {
      CVar4 = (**(code **)(k_local[1].upload_present + 0x68))
                        (conn_local,k_local,&excess,(long)&buffersize + 6);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      nread._4_4_ = CURLE_OK;
      if ((buffersize._6_1_ & 1) != 0) {
        nread._4_4_ = CURLE_OK;
        goto LAB_00142fed;
      }
    }
    if ((*(byte *)(didwhat_local + 0x18) & 1) != 0) {
      dataleft._7_1_ = 0;
      nread._4_4_ = Curl_http_readwrite_headers
                              ((Curl_easy *)conn_local,(connectdata *)k_local,(ssize_t *)&excess,
                               (_Bool *)((long)&dataleft + 7));
      if (nread._4_4_ != CURLE_OK) {
        return nread._4_4_;
      }
      if (((*(long *)(k_local[1].upload_present + 0x68) != 0) && (*(long *)(didwhat_local + 4) < 1))
         && (0 < (long)excess)) {
        CVar4 = (**(code **)(k_local[1].upload_present + 0x68))
                          (conn_local,k_local,&excess,(long)&buffersize + 6);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        if ((buffersize._6_1_ & 1) != 0) {
          nread._4_4_ = CURLE_OK;
          goto LAB_00142fed;
        }
      }
      nread._4_4_ = CURLE_OK;
      if ((dataleft._7_1_ & 1) != 0) {
        if (0 < (long)excess) {
          _Var3 = Curl_pipeline_wanted(*(Curl_multi **)(k_local->size + 0x60),1);
          if (_Var3) {
            Curl_infof((Curl_easy *)conn_local,
                       "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",excess,
                       conn_local[0x16].conn_to_host.rawalloc);
            read_rewind((connectdata *)k_local,excess);
          }
          else {
            Curl_infof((Curl_easy *)conn_local,
                       "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                       ,excess,conn_local[0x16].conn_to_host.rawalloc);
          }
        }
        goto LAB_00142fed;
      }
    }
    if (((*(long *)(didwhat_local + 0x20) != 0) && ((*(byte *)(didwhat_local + 0x18) & 1) == 0)) &&
       ((0 < (long)excess || ((buffersize._7_1_ & 1) != 0)))) {
      if (((*(long *)(didwhat_local + 0x54) == 0) && ((buffersize._7_1_ & 1) == 0)) &&
         ((*(uint *)(k_local[1].upload_present + 0x78) & 0x40003) != 0)) {
        if (*(long *)conn_local->tempsock != 0) {
          if ((k_local[1].timeofdoc & 0x100) != 0) {
            didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
            *comeback_local = true;
            return CURLE_OK;
          }
          *(undefined1 *)((long)didwhat_local + 0x171) = 1;
          Curl_infof((Curl_easy *)conn_local,"Ignoring the response-body\n");
        }
        if ((((conn_local[0x16].conn_to_host.dispname != (char *)0x0) &&
             ((*(byte *)(didwhat_local + 0x28) & 1) == 0)) &&
            (*(int *)(conn_local->syserr_buf + 0x10) == 1)) &&
           ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0)) {
          if (*(char **)didwhat_local == conn_local[0x16].conn_to_host.dispname) {
            Curl_infof((Curl_easy *)conn_local,"The entire document is already downloaded");
            *(undefined1 *)((long)&k_local[1].timeofdoc + 1) = 1;
            didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
            *comeback_local = true;
            return CURLE_OK;
          }
          Curl_failf((Curl_easy *)conn_local,
                     "HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
          return CURLE_RANGE_ERROR;
        }
        if (((*(int *)conn_local->syserr_buf != 0) &&
            (conn_local[0x16].conn_to_host.name == (char *)0x0)) &&
           (_Var3 = Curl_meets_timecondition
                              ((Curl_easy *)conn_local,*(time_t *)(didwhat_local + 0x52)), !_Var3))
        {
          *comeback_local = true;
          conn_local[0x16].local_ip[0x20] = '0';
          conn_local[0x16].local_ip[0x21] = '\x01';
          conn_local[0x16].local_ip[0x22] = '\0';
          conn_local[0x16].local_ip[0x23] = '\0';
          Curl_infof((Curl_easy *)conn_local,"Simulate a HTTP 304 response!\n");
          *(undefined1 *)((long)&k_local[1].timeofdoc + 1) = 1;
          return CURLE_OK;
        }
      }
      *(long *)(didwhat_local + 0x54) = *(long *)(didwhat_local + 0x54) + 1;
      if (((ulong)conn_local->trailer & 1) != 0) {
        if (didwhat_local[0x19] == 0) {
          Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_IN,*(char **)(didwhat_local + 0x20),
                     excess,(connectdata *)k_local);
        }
        else {
          Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_IN,*(char **)&conn_local[1].tls_upgraded,
                     *(size_t *)(didwhat_local + 0x1e),(connectdata *)k_local);
          if (didwhat_local[0x19] == 1) {
            Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_IN,*(char **)(didwhat_local + 0x20),
                       excess,(connectdata *)k_local);
          }
        }
      }
      if ((*(byte *)(didwhat_local + 0x66) & 1) != 0) {
        dataleft._0_4_ =
             Curl_httpchunk_read((connectdata *)k_local,*(char **)(didwhat_local + 0x20),excess,
                                 (ssize_t *)&excess);
        data_00 = conn_local;
        if (CHUNKE_OK < (CHUNKcode)dataleft) {
          if ((CHUNKcode)dataleft == CHUNKE_WRITE_ERROR) {
            Curl_failf((Curl_easy *)conn_local,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          pcVar6 = Curl_chunked_strerror((CHUNKcode)dataleft);
          Curl_failf((Curl_easy *)data_00,"%s in chunked-encoding",pcVar6);
          return CURLE_RECV_ERROR;
        }
        if ((CHUNKcode)dataleft == CHUNKE_STOP) {
          didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
          thismuch = k_local->headerbytecount;
          if (thismuch != 0) {
            Curl_infof((Curl_easy *)k_local->size,"Leftovers after chunking: %zu bytes\n",thismuch);
            _Var3 = Curl_pipeline_wanted(*(Curl_multi **)(k_local->size + 0x60),1);
            if (_Var3) {
              Curl_infof((Curl_easy *)k_local->size,"Rewinding %zu bytes\n",thismuch);
              read_rewind((connectdata *)k_local,thismuch);
            }
          }
        }
      }
      if ((didwhat_local[0x19] != 0) && ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0)) {
        *(long *)(didwhat_local + 8) =
             *(long *)(didwhat_local + 0x1e) + *(long *)(didwhat_local + 8);
      }
      if ((*(long *)(didwhat_local + 4) != -1) &&
         (*(long *)(didwhat_local + 4) <= (long)(*(long *)(didwhat_local + 8) + excess))) {
        _maxloops = (*(long *)(didwhat_local + 8) + excess) - *(long *)(didwhat_local + 4);
        if ((_maxloops != 0) && ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0)) {
          _Var3 = Curl_pipeline_wanted(*(Curl_multi **)(k_local->size + 0x60),1);
          if (_Var3) {
            Curl_infof((Curl_easy *)conn_local,
                       "Rewinding stream by : %zu bytes on url %s (size = %lld, maxdownload = %lld, bytecount = %lld, nread = %zd)\n"
                       ,_maxloops,conn_local[0x16].conn_to_host.rawalloc,
                       *(undefined8 *)didwhat_local,*(undefined8 *)(didwhat_local + 4),
                       *(undefined8 *)(didwhat_local + 8),excess);
            read_rewind((connectdata *)k_local,_maxloops);
          }
          else {
            Curl_infof((Curl_easy *)conn_local,
                       "Excess found in a non pipelined read: excess = %zu, size = %lld, maxdownload = %lld, bytecount = %lld\n"
                       ,_maxloops,*(undefined8 *)didwhat_local,*(undefined8 *)(didwhat_local + 4),
                       *(undefined8 *)(didwhat_local + 8));
          }
        }
        excess = *(long *)(didwhat_local + 4) - *(long *)(didwhat_local + 8);
        if ((long)excess < 0) {
          excess = 0;
        }
        didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
      }
      *(size_t *)(didwhat_local + 8) = excess + *(long *)(didwhat_local + 8);
      Curl_pgrsSetDownloadCounter((Curl_easy *)conn_local,*(curl_off_t *)(didwhat_local + 8));
      if (((*(byte *)(didwhat_local + 0x66) & 1) == 0) &&
         (((excess != 0 || (didwhat_local[0x19] != 0)) || ((buffersize._7_1_ & 1) != 0)))) {
        if ((didwhat_local[0x19] != 0) && ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0)) {
          if ((*(long *)(didwhat_local + 4) == -1) ||
             (*(long *)(didwhat_local + 0x1e) <= *(long *)(didwhat_local + 4))) {
            nread._4_4_ = Curl_client_write((connectdata *)k_local,1,
                                            *(char **)&conn_local[1].tls_upgraded,
                                            *(size_t *)(didwhat_local + 0x1e));
          }
          else {
            nread._4_4_ = Curl_client_write((connectdata *)k_local,1,
                                            *(char **)&conn_local[1].tls_upgraded,
                                            *(size_t *)(didwhat_local + 4));
          }
          if (nread._4_4_ != CURLE_OK) {
            return nread._4_4_;
          }
        }
        if ((uint)didwhat_local[0x19] < 2) {
          if ((*(byte *)(k_local->size + 0x549) & 1) == 0) {
            local_bc = didwhat_local[0x34];
          }
          else {
            local_bc = 0;
          }
          if (local_bc == 0) {
            if ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0) {
              if ((*(uint *)(k_local[1].upload_present + 0x78) & 0xc000) == 0) {
                nread._4_4_ = Curl_client_write((connectdata *)k_local,1,
                                                *(char **)(didwhat_local + 0x20),excess);
              }
              else {
                nread._4_4_ = Curl_pop3_write((connectdata *)k_local,
                                              *(char **)(didwhat_local + 0x20),excess);
              }
            }
          }
          else if (local_bc == 1) {
            if ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0) {
              nread._4_4_ = Curl_unencode_deflate_write
                                      ((connectdata *)k_local,(SingleRequest *)didwhat_local,excess)
              ;
            }
          }
          else if (local_bc == 2) {
            if ((*(byte *)((long)didwhat_local + 0x171) & 1) == 0) {
              nread._4_4_ = Curl_unencode_gzip_write
                                      ((connectdata *)k_local,(SingleRequest *)didwhat_local,excess)
              ;
            }
          }
          else {
            Curl_failf((Curl_easy *)conn_local,
                       "Unrecognized content encoding type. libcurl understands `identity\', `deflate\' and `gzip\' content encodings."
                      );
            nread._4_4_ = CURLE_BAD_CONTENT_ENCODING;
          }
        }
        didwhat_local[0x19] = 0;
        if (nread._4_4_ != CURLE_OK) {
          return nread._4_4_;
        }
      }
    }
    if (((*(long *)(k_local[1].upload_present + 0x68) != 0) && (_maxloops != 0)) &&
       (((ulong)k_local[1].buf & 0x100000000000000) == 0)) break;
    if ((buffersize._7_1_ & 1) != 0) {
      didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffe;
    }
    iVar5 = data_pending((connectdata *)k_local);
    iVar1 = (int)buffersize;
    if (iVar5 != 0) {
      buffersize._0_4_ = (int)buffersize + -1;
    }
    if (iVar5 == 0 || iVar1 == 0) {
LAB_00142fed:
      if ((int)buffersize < 1) {
        *(undefined4 *)&k_local[3].z.zalloc = 1;
        *p_Stack_40 = true;
      }
      if (((didwhat_local[0x5b] & 3U) == 2) && ((k_local[1].timeofdoc & 0x100) != 0)) {
        Curl_infof((Curl_easy *)conn_local,
                   "we are done reading and this is set to close, stop send\n");
        didwhat_local[0x5b] = didwhat_local[0x5b] & 0xfffffffd;
      }
      return CURLE_OK;
    }
  }
  *(size_t *)(didwhat_local + 0x20) = excess + *(long *)(didwhat_local + 0x20);
  excess = _maxloops;
  CVar4 = (**(code **)(k_local[1].upload_present + 0x68))
                    (conn_local,k_local,&excess,(long)&buffersize + 6);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  if ((buffersize._6_1_ & 1) != 0) {
    didwhat_local[0x5b] = didwhat_local[0x5b] | 1;
  }
  nread._4_4_ = CURLE_OK;
  goto LAB_00142fed;
}

Assistant:

static CURLcode readwrite_data(struct Curl_easy *data,
                               struct connectdata *conn,
                               struct SingleRequest *k,
                               int *didwhat, bool *done,
                               bool *comeback)
{
  CURLcode result = CURLE_OK;
  ssize_t nread; /* number of bytes read */
  size_t excess = 0; /* excess bytes read */
  bool is_empty_data = FALSE;
  bool readmore = FALSE; /* used by RTP to signal for more data */
  int maxloops = 100;

  *done = FALSE;
  *comeback = FALSE;

  /* This is where we loop until we have read everything there is to
     read or we get a CURLE_AGAIN */
  do {
    size_t buffersize = data->set.buffer_size?
      data->set.buffer_size : BUFSIZE;
    size_t bytestoread = buffersize;

    if(
#if defined(USE_NGHTTP2)
       /* For HTTP/2, read data without caring about the content
          length. This is safe because body in HTTP/2 is always
          segmented thanks to its framing layer. Meanwhile, we have to
          call Curl_read to ensure that http2_handle_stream_close is
          called when we read all incoming bytes for a particular
          stream. */
       !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
         conn->httpversion == 20) &&
#endif
       k->size != -1 && !k->header) {
      /* make sure we don't read "too much" if we can help it since we
         might be pipelining and then someone else might want to read what
         follows! */
      curl_off_t totalleft = k->size - k->bytecount;
      if(totalleft < (curl_off_t)bytestoread)
        bytestoread = (size_t)totalleft;
    }

    if(bytestoread) {
      /* receive data from the network! */
      result = Curl_read(conn, conn->sockfd, k->buf, bytestoread, &nread);

      /* read would've blocked */
      if(CURLE_AGAIN == result)
        break; /* get out of loop */

      if(result>0)
        return result;
    }
    else {
      /* read nothing but since we wanted nothing we consider this an OK
         situation to proceed from */
      DEBUGF(infof(data, "readwrite_data: we're done!\n"));
      nread = 0;
    }

    if((k->bytecount == 0) && (k->writebytecount == 0)) {
      Curl_pgrsTime(data, TIMER_STARTTRANSFER);
      if(k->exp100 > EXP100_SEND_DATA)
        /* set time stamp to compare with when waiting for the 100 */
        k->start100 = Curl_tvnow();
    }

    *didwhat |= KEEP_RECV;
    /* indicates data of zero size, i.e. empty file */
    is_empty_data = ((nread == 0) && (k->bodywrites == 0)) ? TRUE : FALSE;

    /* NUL terminate, allowing string ops to be used */
    if(0 < nread || is_empty_data) {
      k->buf[nread] = 0;
    }
    else if(0 >= nread) {
      /* if we receive 0 or less here, the server closed the connection
         and we bail out from this! */
      DEBUGF(infof(data, "nread <= 0, server closed connection, bailing\n"));
      k->keepon &= ~KEEP_RECV;
      break;
    }

    /* Default buffer to use when we write the buffer, it may be changed
       in the flow below before the actual storing is done. */
    k->str = k->buf;

    if(conn->handler->readwrite) {
      result = conn->handler->readwrite(data, conn, &nread, &readmore);
      if(result)
        return result;
      if(readmore)
        break;
    }

#ifndef CURL_DISABLE_HTTP
    /* Since this is a two-state thing, we check if we are parsing
       headers at the moment or not. */
    if(k->header) {
      /* we are in parse-the-header-mode */
      bool stop_reading = FALSE;
      result = Curl_http_readwrite_headers(data, conn, &nread, &stop_reading);
      if(result)
        return result;

      if(conn->handler->readwrite &&
         (k->maxdownload <= 0 && nread > 0)) {
        result = conn->handler->readwrite(data, conn, &nread, &readmore);
        if(result)
          return result;
        if(readmore)
          break;
      }

      if(stop_reading) {
        /* We've stopped dealing with input, get out of the do-while loop */

        if(nread > 0) {
          if(Curl_pipeline_wanted(conn->data->multi, CURLPIPE_HTTP1)) {
            infof(data,
                  "Rewinding stream by : %zd"
                  " bytes on url %s (zero-length body)\n",
                  nread, data->state.path);
            read_rewind(conn, (size_t)nread);
          }
          else {
            infof(data,
                  "Excess found in a non pipelined read:"
                  " excess = %zd"
                  " url = %s (zero-length body)\n",
                  nread, data->state.path);
          }
        }

        break;
      }
    }
#endif /* CURL_DISABLE_HTTP */


    /* This is not an 'else if' since it may be a rest from the header
       parsing, where the beginning of the buffer is headers and the end
       is non-headers. */
    if(k->str && !k->header && (nread > 0 || is_empty_data)) {

#ifndef CURL_DISABLE_HTTP
      if(0 == k->bodywrites && !is_empty_data) {
        /* These checks are only made the first time we are about to
           write a piece of the body */
        if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
          /* HTTP-only checks */

          if(data->req.newurl) {
            if(conn->bits.close) {
              /* Abort after the headers if "follow Location" is set
                 and we're set to close anyway. */
              k->keepon &= ~KEEP_RECV;
              *done = TRUE;
              return CURLE_OK;
            }
            /* We have a new url to load, but since we want to be able
               to re-use this connection properly, we read the full
               response in "ignore more" */
            k->ignorebody = TRUE;
            infof(data, "Ignoring the response-body\n");
          }
          if(data->state.resume_from && !k->content_range &&
             (data->set.httpreq==HTTPREQ_GET) &&
             !k->ignorebody) {

            if(k->size == data->state.resume_from) {
              /* The resume point is at the end of file, consider this fine
                 even if it doesn't allow resume from here. */
              infof(data, "The entire document is already downloaded");
              connclose(conn, "already downloaded");
              /* Abort download */
              k->keepon &= ~KEEP_RECV;
              *done = TRUE;
              return CURLE_OK;
            }

            /* we wanted to resume a download, although the server doesn't
             * seem to support this and we did this with a GET (if it
             * wasn't a GET we did a POST or PUT resume) */
            failf(data, "HTTP server doesn't seem to support "
                  "byte ranges. Cannot resume.");
            return CURLE_RANGE_ERROR;
          }

          if(data->set.timecondition && !data->state.range) {
            /* A time condition has been set AND no ranges have been
               requested. This seems to be what chapter 13.3.4 of
               RFC 2616 defines to be the correct action for a
               HTTP/1.1 client */

            if(!Curl_meets_timecondition(data, k->timeofdoc)) {
              *done = TRUE;
              /* We're simulating a http 304 from server so we return
                 what should have been returned from the server */
              data->info.httpcode = 304;
              infof(data, "Simulate a HTTP 304 response!\n");
              /* we abort the transfer before it is completed == we ruin the
                 re-use ability. Close the connection */
              connclose(conn, "Simulated 304 handling");
              return CURLE_OK;
            }
          } /* we have a time condition */

        } /* this is HTTP or RTSP */
      } /* this is the first time we write a body part */
#endif /* CURL_DISABLE_HTTP */

      k->bodywrites++;

      /* pass data to the debug function before it gets "dechunked" */
      if(data->set.verbose) {
        if(k->badheader) {
          Curl_debug(data, CURLINFO_DATA_IN, data->state.headerbuff,
                     (size_t)k->hbuflen, conn);
          if(k->badheader == HEADER_PARTHEADER)
            Curl_debug(data, CURLINFO_DATA_IN,
                       k->str, (size_t)nread, conn);
        }
        else
          Curl_debug(data, CURLINFO_DATA_IN,
                     k->str, (size_t)nread, conn);
      }

#ifndef CURL_DISABLE_HTTP
      if(k->chunk) {
        /*
         * Here comes a chunked transfer flying and we need to decode this
         * properly.  While the name says read, this function both reads
         * and writes away the data. The returned 'nread' holds the number
         * of actual data it wrote to the client.
         */

        CHUNKcode res =
          Curl_httpchunk_read(conn, k->str, nread, &nread);

        if(CHUNKE_OK < res) {
          if(CHUNKE_WRITE_ERROR == res) {
            failf(data, "Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          failf(data, "%s in chunked-encoding", Curl_chunked_strerror(res));
          return CURLE_RECV_ERROR;
        }
        else if(CHUNKE_STOP == res) {
          size_t dataleft;
          /* we're done reading chunks! */
          k->keepon &= ~KEEP_RECV; /* read no more */

          /* There are now possibly N number of bytes at the end of the
             str buffer that weren't written to the client.

             We DO care about this data if we are pipelining.
             Push it back to be read on the next pass. */

          dataleft = conn->chunk.dataleft;
          if(dataleft != 0) {
            infof(conn->data, "Leftovers after chunking: %zu bytes\n",
                  dataleft);
            if(Curl_pipeline_wanted(conn->data->multi, CURLPIPE_HTTP1)) {
              /* only attempt the rewind if we truly are pipelining */
              infof(conn->data, "Rewinding %zu bytes\n",dataleft);
              read_rewind(conn, dataleft);
            }
          }
        }
        /* If it returned OK, we just keep going */
      }
#endif   /* CURL_DISABLE_HTTP */

      /* Account for body content stored in the header buffer */
      if(k->badheader && !k->ignorebody) {
        DEBUGF(infof(data, "Increasing bytecount by %zu from hbuflen\n",
                     k->hbuflen));
        k->bytecount += k->hbuflen;
      }

      if((-1 != k->maxdownload) &&
         (k->bytecount + nread >= k->maxdownload)) {

        excess = (size_t)(k->bytecount + nread - k->maxdownload);
        if(excess > 0 && !k->ignorebody) {
          if(Curl_pipeline_wanted(conn->data->multi, CURLPIPE_HTTP1)) {
            /* The 'excess' amount below can't be more than BUFSIZE which
               always will fit in a size_t */
            infof(data,
                  "Rewinding stream by : %zu"
                  " bytes on url %s (size = %" CURL_FORMAT_CURL_OFF_T
                  ", maxdownload = %" CURL_FORMAT_CURL_OFF_T
                  ", bytecount = %" CURL_FORMAT_CURL_OFF_T ", nread = %zd)\n",
                  excess, data->state.path,
                  k->size, k->maxdownload, k->bytecount, nread);
            read_rewind(conn, excess);
          }
          else {
            infof(data,
                  "Excess found in a non pipelined read:"
                  " excess = %zu"
                  ", size = %" CURL_FORMAT_CURL_OFF_T
                  ", maxdownload = %" CURL_FORMAT_CURL_OFF_T
                  ", bytecount = %" CURL_FORMAT_CURL_OFF_T "\n",
                  excess, k->size, k->maxdownload, k->bytecount);
          }
        }

        nread = (ssize_t) (k->maxdownload - k->bytecount);
        if(nread < 0) /* this should be unusual */
          nread = 0;

        k->keepon &= ~KEEP_RECV; /* we're done reading */
      }

      k->bytecount += nread;

      Curl_pgrsSetDownloadCounter(data, k->bytecount);

      if(!k->chunk && (nread || k->badheader || is_empty_data)) {
        /* If this is chunky transfer, it was already written */

        if(k->badheader && !k->ignorebody) {
          /* we parsed a piece of data wrongly assuming it was a header
             and now we output it as body instead */

          /* Don't let excess data pollute body writes */
          if(k->maxdownload == -1 || (curl_off_t)k->hbuflen <= k->maxdownload)
            result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                       data->state.headerbuff,
                                       k->hbuflen);
          else
            result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                       data->state.headerbuff,
                                       (size_t)k->maxdownload);

          if(result)
            return result;
        }
        if(k->badheader < HEADER_ALLBAD) {
          /* This switch handles various content encodings. If there's an
             error here, be sure to check over the almost identical code
             in http_chunks.c.
             Make sure that ALL_CONTENT_ENCODINGS contains all the
             encodings handled here. */
#ifdef HAVE_LIBZ
          switch (conn->data->set.http_ce_skip ?
                  IDENTITY : k->auto_decoding) {
          case IDENTITY:
#endif
            /* This is the default when the server sends no
               Content-Encoding header. See Curl_readwrite_init; the
               memset() call initializes k->auto_decoding to zero. */
            if(!k->ignorebody) {

#ifndef CURL_DISABLE_POP3
              if(conn->handler->protocol&PROTO_FAMILY_POP3)
                result = Curl_pop3_write(conn, k->str, nread);
              else
#endif /* CURL_DISABLE_POP3 */

                result = Curl_client_write(conn, CLIENTWRITE_BODY, k->str,
                                           nread);
            }
#ifdef HAVE_LIBZ
            break;

          case DEFLATE:
            /* Assume CLIENTWRITE_BODY; headers are not encoded. */
            if(!k->ignorebody)
              result = Curl_unencode_deflate_write(conn, k, nread);
            break;

          case GZIP:
            /* Assume CLIENTWRITE_BODY; headers are not encoded. */
            if(!k->ignorebody)
              result = Curl_unencode_gzip_write(conn, k, nread);
            break;

          default:
            failf (data, "Unrecognized content encoding type. "
                   "libcurl understands `identity', `deflate' and `gzip' "
                   "content encodings.");
            result = CURLE_BAD_CONTENT_ENCODING;
            break;
          }
#endif
        }
        k->badheader = HEADER_NORMAL; /* taken care of now */

        if(result)
          return result;
      }

    } /* if(!header and data to read) */

    if(conn->handler->readwrite &&
       (excess > 0 && !conn->bits.stream_was_rewound)) {
      /* Parse the excess data */
      k->str += nread;
      nread = (ssize_t)excess;

      result = conn->handler->readwrite(data, conn, &nread, &readmore);
      if(result)
        return result;

      if(readmore)
        k->keepon |= KEEP_RECV; /* we're not done reading */
      break;
    }

    if(is_empty_data) {
      /* if we received nothing, the server closed the connection and we
         are done */
      k->keepon &= ~KEEP_RECV;
    }

  } while(data_pending(conn) && maxloops--);

  if(maxloops <= 0) {
    /* we mark it as read-again-please */
    conn->cselect_bits = CURL_CSELECT_IN;
    *comeback = TRUE;
  }

  if(((k->keepon & (KEEP_RECV|KEEP_SEND)) == KEEP_SEND) &&
     conn->bits.close) {
    /* When we've read the entire thing and the close bit is set, the server
       may now close the connection. If there's now any kind of sending going
       on from our side, we need to stop that immediately. */
    infof(data, "we are done reading and this is set to close, stop send\n");
    k->keepon &= ~KEEP_SEND; /* no writing anymore either */
  }

  return CURLE_OK;
}